

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void SuperSpread_Test_Hitter<4u>(string *PATH)

{
  char *PATH_00;
  long *plVar1;
  code *pcVar2;
  Abstract<4U> *this;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer ppbVar6;
  int iVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  WavingSketch<8U,_16U,_4U> *this_00;
  TLF<4U> *this_01;
  OLF<4U> *this_02;
  OpenSketch<4U> *this_03;
  SpreadSketchWrapper<4U> *this_04;
  ostream *poVar9;
  Data<4U> *__ptr;
  iterator iVar10;
  mapped_type *pmVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  undefined8 *puVar14;
  undefined1 auVar15 [8];
  undefined8 uVar16;
  uint32_t j;
  long lVar17;
  ulong uVar18;
  long lVar19;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_348;
  undefined1 local_310 [8];
  ofstream out;
  undefined1 local_110 [8];
  string file;
  undefined1 local_e0 [8];
  StreamMap<4U> sp;
  HashMap<4U> mp;
  undefined1 local_68 [8];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  Data<4U> to;
  int local_3c;
  key_type local_38;
  int cnt;
  Data<4U> from;
  
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)local_68,4,(allocator_type *)local_310);
  std::__cxx11::string::string((string *)local_110,"caida",(allocator *)local_310);
  pbVar8 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &RESULT_FOLDER_abi_cxx11_,"superSpread_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,"_ARE.csv");
  std::ofstream::ofstream(pbVar8,(string *)local_310,_S_out);
  *(basic_ostream<char,_std::char_traits<char>_> **)local_68 = pbVar8;
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)&sp._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)local_e0);
  pbVar8 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &RESULT_FOLDER_abi_cxx11_,"superSpread_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,"_Recall Rate (RR).csv");
  std::ofstream::ofstream(pbVar8,(string *)local_310,_S_out);
  *(basic_ostream<char,_std::char_traits<char>_> **)((long)local_68 + 8) = pbVar8;
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)&sp._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)local_e0);
  pbVar8 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &RESULT_FOLDER_abi_cxx11_,"superSpread_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,"_Precision Rate (PR).csv");
  std::ofstream::ofstream(pbVar8,(string *)local_310,_S_out);
  *(basic_ostream<char,_std::char_traits<char>_> **)((long)local_68 + 0x10) = pbVar8;
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)&sp._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)local_e0);
  pbVar8 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &RESULT_FOLDER_abi_cxx11_,"superSpread_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &sp._M_h._M_single_bucket,"_F1.csv");
  std::ofstream::ofstream(pbVar8,(string *)local_310,_S_out);
  *(basic_ostream<char,_std::char_traits<char>_> **)((long)local_68 + 0x18) = pbVar8;
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)&sp._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)local_e0);
  iVar7 = 0;
  uVar16 = &local_348;
  while (iVar7 != 5) {
    cnt = iVar7 * 100000 + 600000;
    uVar3 = (ulong)(uint)cnt;
    uVar18 = uVar3 / 1000;
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar7;
    *(undefined8 *)(uVar16 + -8) = 0x107018;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",uVar18,uVar3 % 1000);
    puVar14 = (undefined8 *)(uVar16 + -0x30);
    file.field_2._8_8_ = uVar16;
    *(undefined8 *)(uVar16 + -0x38) = 0x107033;
    this_00 = (WavingSketch<8U,_16U,_4U> *)operator_new(0xa8);
    iVar7 = cnt;
    *(undefined8 *)(uVar16 + -0x38) = 0x54;
    uVar4 = *(undefined8 *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 3;
    uVar5 = *(undefined8 *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 0x107047;
    WavingSketch<8U,_16U,_4U>::WavingSketch(this_00,iVar7,(int)uVar4,(uint32_t)uVar5);
    *puVar14 = this_00;
    *(undefined8 *)(uVar16 + -0x38) = 0x107054;
    this_01 = (TLF<4U> *)operator_new(0x120);
    iVar7 = cnt;
    *(undefined8 *)(uVar16 + -0x38) = 0x54;
    uVar4 = *(undefined8 *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 0x107065;
    TLF<4U>::TLF(this_01,iVar7,(int)uVar4);
    *(TLF<4U> **)(uVar16 + -0x28) = this_01;
    *(undefined8 *)(uVar16 + -0x38) = 0x107073;
    this_02 = (OLF<4U> *)operator_new(0xe8);
    iVar7 = cnt;
    *(undefined8 *)(uVar16 + -0x38) = 0x54;
    uVar4 = *(undefined8 *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 0x107084;
    OLF<4U>::OLF(this_02,iVar7,(int)uVar4);
    *(OLF<4U> **)(uVar16 + -0x20) = this_02;
    *(undefined8 *)(uVar16 + -0x38) = 0x107092;
    this_03 = (OpenSketch<4U> *)operator_new(0xd0);
    iVar7 = cnt;
    *(undefined8 *)(uVar16 + -0x38) = 0x54;
    uVar4 = *(undefined8 *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 0x1070a3;
    OpenSketch<4U>::OpenSketch(this_03,iVar7,(int)uVar4);
    *(OpenSketch<4U> **)(uVar16 + -0x18) = this_03;
    *(undefined8 *)(uVar16 + -0x38) = 0x78;
    uVar3 = *(ulong *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 0x1070af;
    this_04 = (SpreadSketchWrapper<4U> *)operator_new(uVar3);
    iVar7 = cnt;
    *(undefined8 *)(uVar16 + -0x38) = 0x54;
    uVar4 = *(undefined8 *)(uVar16 + -0x38);
    *(undefined8 *)(uVar16 + -0x38) = 0x1070c0;
    SpreadSketchWrapper<4U>::SpreadSketchWrapper(this_04,iVar7,(int)uVar4);
    *(SpreadSketchWrapper<4U> **)(uVar16 + -0x10) = this_04;
    ppbVar6 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _to = outs.
          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
    auVar15 = local_68;
    if (outs.
        super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      mp._M_h._M_single_bucket._4_4_ = (uint)uVar18;
      for (; auVar15 != (undefined1  [8])ppbVar6; auVar15 = (undefined1  [8])((long)auVar15 + 8)) {
        poVar9 = *(ostream **)auVar15;
        *(undefined8 *)(uVar16 + -0x38) = 0x1070f3;
        poVar9 = std::operator<<(poVar9,"MEM(KB)");
        *(undefined8 *)(uVar16 + -0x38) = 0x107102;
        std::operator<<(poVar9,",");
        for (lVar17 = 0; poVar9 = *(ostream **)auVar15, lVar17 != 5; lVar17 = lVar17 + 1) {
          lVar19 = puVar14[lVar17];
          *(undefined8 *)(uVar16 + -0x38) = 0x10711b;
          poVar9 = std::operator<<(poVar9,(string *)(lVar19 + 8));
          *(undefined8 *)(uVar16 + -0x38) = 0x10712a;
          std::operator<<(poVar9,",");
        }
        *(undefined8 *)(uVar16 + -0x38) = 0x107134;
        std::endl<char,std::char_traits<char>>(poVar9);
        uVar18 = (ulong)mp._M_h._M_single_bucket._4_4_;
      }
      _to = outs.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
      auVar15 = local_68;
    }
    for (; auVar15 != (undefined1  [8])_to; auVar15 = (undefined1  [8])((long)auVar15 + 8)) {
      poVar9 = *(ostream **)auVar15;
      *(undefined8 *)(uVar16 + -0x38) = 0x107157;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar18);
      *(undefined8 *)(uVar16 + -0x38) = 0x107166;
      std::operator<<(poVar9,",");
    }
    sp._M_h._M_single_bucket = (__node_base_ptr)&mp._M_h._M_rehash_policy._M_next_resize;
    *(undefined8 *)(uVar16 + -0x38) = 1;
    sp._M_h._M_buckets = *(__buckets_ptr *)(uVar16 + -0x38);
    mp._M_h._M_bucket_count = 0;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    mp._M_h._M_element_count._0_4_ = 0x3f800000;
    mp._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    mp._M_h._M_rehash_policy._4_4_ = 0;
    mp._M_h._M_rehash_policy._M_next_resize = 0;
    local_e0 = (undefined1  [8])&sp._M_h._M_rehash_policy._M_next_resize;
    sp._M_h._M_bucket_count = 0;
    sp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sp._M_h._M_element_count._0_4_ = 0x3f800000;
    sp._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    sp._M_h._M_rehash_policy._4_4_ = 0;
    sp._M_h._M_rehash_policy._M_next_resize = 0;
    PATH_00 = (PATH->_M_dataplus)._M_p;
    mp._M_h._M_buckets = sp._M_h._M_buckets;
    *(undefined8 *)(uVar16 + -0x38) = 0x1071e7;
    __ptr = read_standard_pair_data<4u>(PATH_00,record_length,&local_3c);
    local_38.str[0] = '\0';
    local_38.str[1] = '\0';
    local_38.str[2] = '\0';
    local_38.str[3] = '\0';
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = '\0';
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = '\0';
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = '\0';
    if (9999999 < local_3c) {
      local_3c = 10000000;
    }
    for (lVar17 = 0; lVar17 < local_3c; lVar17 = lVar17 + 1) {
      local_310._0_4_ = *(undefined4 *)__ptr[lVar17 * 2].str;
      local_310._4_4_ = *(undefined4 *)__ptr[lVar17 * 2 + 1].str;
      outs.
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_310._4_4_;
      local_38.str = (uchar  [4])local_310._0_4_;
      *(undefined8 *)(uVar16 + -0x38) = 0x107243;
      iVar10 = std::
               _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_e0,(key_type *)local_310);
      if (iVar10.super__Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        *(undefined8 *)(uVar16 + -0x38) = 0x10725b;
        pmVar11 = std::__detail::
                  _Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_e0,(key_type *)local_310);
        *pmVar11 = 1;
        *(undefined8 *)(uVar16 + -0x38) = 0x107270;
        iVar12 = std::
                 _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&sp._M_h._M_single_bucket,&local_38);
        if (iVar12.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)(uVar16 + -0x38) = 0x107297;
          pmVar13 = std::__detail::
                    _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&sp._M_h._M_single_bucket,&local_38);
          *pmVar13 = 1;
        }
        else {
          *(undefined8 *)(uVar16 + -0x38) = 0x107284;
          pmVar13 = std::__detail::
                    _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&sp._M_h._M_single_bucket,&local_38);
          *pmVar13 = *pmVar13 + 1;
        }
      }
      for (lVar19 = 0; lVar19 != 5; lVar19 = lVar19 + 1) {
        plVar1 = (long *)puVar14[lVar19];
        pcVar2 = *(code **)(*plVar1 + 0x28);
        *(undefined8 *)(uVar16 + -0x38) = 0x1072b6;
        (*pcVar2)(plVar1,&local_38,
                  &outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    *(undefined8 *)(uVar16 + -0x38) = 0x1072cf;
    free(__ptr);
    for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
      plVar1 = (long *)puVar14[lVar17];
      *(undefined8 *)(uVar16 + -0x38) = 0x1072f7;
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_348,
                   (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&sp._M_h._M_single_bucket);
      pcVar2 = *(code **)(*plVar1 + 0x30);
      *(undefined8 *)(uVar16 + -0x38) = 0x107307;
      (*pcVar2)(plVar1,&local_348,local_68);
      *(undefined8 *)(uVar16 + -0x38) = 0x10730f;
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_348);
    }
    *(undefined8 *)(uVar16 + -0x38) = 0x10732a;
    std::ofstream::ofstream(local_310);
    for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
      *(undefined8 *)(uVar16 + -0x38) = 0x107341;
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      iVar7 = cnt;
      this = (Abstract<4U> *)puVar14[lVar17];
      *(undefined8 *)(uVar16 + -0x38) = 0x107354;
      Abstract<4U>::print_f1(this,(ofstream *)local_310,iVar7);
    }
    for (lVar17 = 0;
        ppbVar6 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, auVar15 = local_68, lVar17 != 5;
        lVar17 = lVar17 + 1) {
      if ((long *)puVar14[lVar17] != (long *)0x0) {
        pcVar2 = *(code **)(*(long *)puVar14[lVar17] + 0x48);
        *(undefined8 *)(uVar16 + -0x38) = 0x107371;
        (*pcVar2)();
      }
    }
    for (; auVar15 != (undefined1  [8])ppbVar6; auVar15 = (undefined1  [8])((long)auVar15 + 8)) {
      poVar9 = *(ostream **)auVar15;
      *(undefined8 *)(uVar16 + -0x38) = 0x10738b;
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    *(undefined8 *)(uVar16 + -0x38) = 0x10739d;
    std::ofstream::~ofstream(local_310);
    *(undefined8 *)(uVar16 + -0x38) = 0x1073a9;
    std::
    _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_e0);
    *(undefined8 *)(uVar16 + -0x38) = 0x1073b5;
    std::
    _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&sp._M_h._M_single_bucket);
    uVar16 = file.field_2._8_8_;
    iVar7 = outs.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  *(undefined8 *)(uVar16 + -8) = 0x1073d2;
  std::__cxx11::string::~string((string *)local_110);
  *(undefined8 *)(uVar16 + -8) = 0x1073db;
  std::
  _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~_Vector_base((_Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   *)local_68);
  return;
}

Assistant:

void SuperSpread_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 5;
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, SuperSpread_HIT);
		sketch[1] = new TLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[2] = new OLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[3] = new OpenSketch<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[4] = new SpreadSketchWrapper<DATA_LEN>(memory, SuperSpread_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		HashMap<DATA_LEN> mp;
		StreamMap<DATA_LEN> sp;

		int cnt;
		Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
		Data<DATA_LEN> from;
		Data<DATA_LEN> to;
		int num = 0;
		cnt = std::min(cnt, MAX_PACKET);
		while (num < cnt) {
			from = records[num * 2];
			to = records[num * 2 + 1];

			/*
			num++;
			if(num % 1000000 == 0){
				cout << num << endl;
			}
			*/

			Stream<DATA_LEN> stream(from, to);
			if (sp.find(stream) == sp.end()) {
				sp[stream] = 1;
				if (mp.find(from) == mp.end())
					mp[from] = 1;
				else
					mp[from] += 1;
			}
			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(from, to);
			}
			num++;
		}
		free(records);
		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}